

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::BasicSelector>::copyAppend
          (QGenericArrayOps<QCss::BasicSelector> *this,BasicSelector *b,BasicSelector *e)

{
  BasicSelector *pBVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  long lVar6;
  
  if ((b != e) && (b < e)) {
    pBVar1 = (this->super_QArrayDataPointer<QCss::BasicSelector>).ptr;
    lVar6 = (this->super_QArrayDataPointer<QCss::BasicSelector>).size;
    do {
      pDVar2 = (b->elementName).d.d;
      pBVar1[lVar6].elementName.d.d = pDVar2;
      pBVar1[lVar6].elementName.d.ptr = (b->elementName).d.ptr;
      pBVar1[lVar6].elementName.d.size = (b->elementName).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar3 = (b->ids).d.d;
      pBVar1[lVar6].ids.d.d = pDVar3;
      pBVar1[lVar6].ids.d.ptr = (b->ids).d.ptr;
      pBVar1[lVar6].ids.d.size = (b->ids).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->pseudos).d.d;
      pBVar1[lVar6].pseudos.d.d = pDVar4;
      pBVar1[lVar6].pseudos.d.ptr = (b->pseudos).d.ptr;
      pBVar1[lVar6].pseudos.d.size = (b->pseudos).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (b->attributeSelectors).d.d;
      pBVar1[lVar6].attributeSelectors.d.d = pDVar5;
      pBVar1[lVar6].attributeSelectors.d.ptr = (b->attributeSelectors).d.ptr;
      pBVar1[lVar6].attributeSelectors.d.size = (b->attributeSelectors).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pBVar1[lVar6].relationToNext = b->relationToNext;
      b = b + 1;
      lVar6 = (this->super_QArrayDataPointer<QCss::BasicSelector>).size + 1;
      (this->super_QArrayDataPointer<QCss::BasicSelector>).size = lVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }